

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MemPool.cpp
# Opt level: O1

void amrex_mempool_finalize(void)

{
  long *plVar1;
  long *plVar2;
  pointer *__ptr;
  long *plVar3;
  
  plVar2 = DAT_007571d0;
  plVar1 = (anonymous_namespace)::the_memory_pool;
  (anonymous_namespace)::initialized = 0;
  plVar3 = (anonymous_namespace)::the_memory_pool;
  if (DAT_007571d0 != (anonymous_namespace)::the_memory_pool) {
    do {
      if ((long *)*plVar3 != (long *)0x0) {
        (**(code **)(*(long *)*plVar3 + 8))();
      }
      *plVar3 = 0;
      plVar3 = plVar3 + 1;
    } while (plVar3 != plVar2);
    DAT_007571d0 = plVar1;
  }
  return;
}

Assistant:

void amrex_mempool_finalize ()
{
    initialized = false;
    the_memory_pool.clear();
}